

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O1

void Fossilize::hash_variant
               (Hasher *h,VariantDependency dep,VkPhysicalDeviceProperties2 *props,
               VkApplicationInfo *info,void *device_pnext,bool feature_hash)

{
  byte bVar1;
  bool bVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  uint uVar8;
  byte *pbVar9;
  ulong uVar10;
  bool bVar11;
  
  switch(dep) {
  case VendorID:
    if (props == (VkPhysicalDeviceProperties2 *)0x0) break;
    uVar10 = (ulong)(props->properties).vendorID;
    goto LAB_00104f03;
  case MutableDescriptorType:
    for (; (int *)device_pnext != (int *)0x0; device_pnext = *(void **)((long)device_pnext + 8)) {
      if (*device_pnext == 0x3ba02518) goto LAB_00105042;
    }
    device_pnext = (int *)0x0;
LAB_00105042:
    if ((int *)device_pnext == (int *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (uint)(*(int *)((long)device_pnext + 0x10) != 0);
    }
    uVar8 = (uint)(byte)(!feature_hash | (byte)uVar6);
    if ((feature_hash) && ((byte)uVar6 != 0)) {
      h->h = h->h * 0x100000001b3 ^ 0x3ba02518;
      uVar8 = uVar6;
    }
    if (uVar8 == 0) {
      return;
    }
    uVar10 = h->h * 0x100000001b3;
    uVar5 = (ulong)uVar6;
    goto LAB_00104f11;
  case BindlessUBO:
    for (piVar3 = (int *)device_pnext; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
      if (*piVar3 == 0x3b9d3ee9) goto LAB_00104f6a;
    }
    piVar3 = (int *)0x0;
LAB_00104f6a:
    do {
      if ((int *)device_pnext == (int *)0x0) goto LAB_00104f87;
      if (*device_pnext == 0x33) goto LAB_00104f89;
      device_pnext = *(void **)((long)device_pnext + 8);
    } while( true );
  case BufferDeviceAddress:
    for (piVar3 = (int *)device_pnext; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
      if (*piVar3 == 0x3b9eb5e8) goto LAB_00104ff8;
    }
    piVar3 = (int *)0x0;
LAB_00104ff8:
    do {
      if ((int *)device_pnext == (int *)0x0) goto LAB_00105015;
      if (*device_pnext == 0x33) goto LAB_00105017;
      device_pnext = *(void **)((long)device_pnext + 8);
    } while( true );
  case ApplicationVersion:
    if (info != (VkApplicationInfo *)0x0) {
      uVar10 = (ulong)info->applicationVersion;
      goto LAB_00104f03;
    }
    break;
  case EngineVersion:
    if (info != (VkApplicationInfo *)0x0) {
      uVar10 = (ulong)info->engineVersion;
      goto LAB_00104f03;
    }
    break;
  case ApplicationVersionMajor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar6 = info->applicationVersion;
LAB_00104ed9:
      uVar10 = (ulong)(uVar6 >> 0x16);
      goto LAB_00104f03;
    }
    break;
  case ApplicationVersionMinor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar6 = info->applicationVersion;
LAB_00104ee6:
      uVar10 = (ulong)(uVar6 >> 0xc & 0x3ff);
      goto LAB_00104f03;
    }
    break;
  case ApplicationVersionPatch:
    if (info != (VkApplicationInfo *)0x0) {
      uVar6 = info->applicationVersion;
LAB_00104ef9:
      uVar10 = (ulong)(uVar6 & 0xfff);
      goto LAB_00104f03;
    }
    break;
  case EngineVersionMajor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar6 = info->engineVersion;
      goto LAB_00104ed9;
    }
    break;
  case EngineVersionMinor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar6 = info->engineVersion;
      goto LAB_00104ee6;
    }
    break;
  case EngineVersionPatch:
    if (info != (VkApplicationInfo *)0x0) {
      uVar6 = info->engineVersion;
      goto LAB_00104ef9;
    }
    break;
  case ApplicationName:
    if (info == (VkApplicationInfo *)0x0) {
      pbVar9 = (byte *)0x0;
    }
    else {
      pbVar9 = (byte *)info->pApplicationName;
    }
    pbVar7 = (byte *)0x109ce0;
    if (pbVar9 != (byte *)0x0) {
      pbVar7 = pbVar9;
    }
    uVar10 = h->h * 0x100000001b3 ^ 0xff;
    h->h = uVar10;
    bVar1 = *pbVar7;
    while (bVar1 != 0) {
      pbVar7 = pbVar7 + 1;
      uVar10 = uVar10 * 0x100000001b3 ^ (ulong)bVar1;
      h->h = uVar10;
      bVar1 = *pbVar7;
    }
    return;
  case EngineName:
    if (info == (VkApplicationInfo *)0x0) {
      pbVar9 = (byte *)0x0;
    }
    else {
      pbVar9 = (byte *)info->pEngineName;
    }
    pbVar7 = (byte *)0x109ce0;
    if (pbVar9 != (byte *)0x0) {
      pbVar7 = pbVar9;
    }
    uVar10 = h->h * 0x100000001b3 ^ 0xff;
    h->h = uVar10;
    bVar1 = *pbVar7;
    while (bVar1 != 0) {
      pbVar7 = pbVar7 + 1;
      uVar10 = uVar10 * 0x100000001b3 ^ (ulong)bVar1;
      h->h = uVar10;
      bVar1 = *pbVar7;
    }
    return;
  case FragmentShadingRate:
    for (; (int *)device_pnext != (int *)0x0; device_pnext = *(void **)((long)device_pnext + 8)) {
      if (*device_pnext == 0x3b9e3cd3) goto LAB_00104f3d;
    }
    device_pnext = (int *)0x0;
LAB_00104f3d:
    if ((int *)device_pnext == (int *)0x0) {
      bVar11 = false;
    }
    else {
      bVar11 = true;
      if ((*(int *)((long)device_pnext + 0x18) == 0) && (*(int *)((long)device_pnext + 0x10) == 0))
      {
        bVar11 = *(int *)((long)device_pnext + 0x14) != 0;
      }
    }
    bVar2 = (bool)(!feature_hash | bVar11);
    if ((feature_hash) && (bVar11)) {
      h->h = h->h * 0x100000001b3 ^ 0x3b9e3cd3;
      bVar2 = bVar11;
    }
    if (!bVar2) {
      return;
    }
    if ((int *)device_pnext == (int *)0x0) {
      h->h = h->h * 0x100000001b3;
      uVar10 = 0;
    }
    else {
      h->h = (ulong)(*(int *)((long)device_pnext + 0x18) != 0) ^ h->h * 0x100000001b3;
      uVar10 = (ulong)(*(int *)((long)device_pnext + 0x10) != 0);
    }
    uVar10 = h->h * 0x100000001b3 ^ uVar10;
    h->h = uVar10;
    uVar5 = 0;
    if ((int *)device_pnext != (int *)0x0) {
      uVar5 = (ulong)(*(int *)((long)device_pnext + 0x14) != 0);
    }
    uVar5 = uVar10 * 0x100000001b3 ^ uVar5;
    goto LAB_00104f14;
  case DynamicRendering:
    for (piVar3 = (int *)device_pnext; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
      if (*piVar3 == 0x3b9b75e3) goto LAB_00104fb1;
    }
    piVar3 = (int *)0x0;
LAB_00104fb1:
    do {
      if ((int *)device_pnext == (int *)0x0) goto LAB_00104fce;
      if (*device_pnext == 0x35) goto LAB_00104fd0;
      device_pnext = *(void **)((long)device_pnext + 8);
    } while( true );
  case DescriptorBuffer:
    for (; (int *)device_pnext != (int *)0x0; device_pnext = *(void **)((long)device_pnext + 8)) {
      if (*device_pnext == 0x3b9f9c62) goto LAB_00104f1a;
    }
    device_pnext = (int *)0x0;
LAB_00104f1a:
    if ((int *)device_pnext == (int *)0x0) {
      bVar11 = false;
    }
    else {
      bVar11 = true;
      if (*(int *)((long)device_pnext + 0x10) == 0) {
        bVar11 = *(int *)((long)device_pnext + 0x1c) != 0;
      }
    }
    bVar2 = (bool)(!feature_hash | bVar11);
    if ((feature_hash) && (bVar11)) {
      h->h = h->h * 0x100000001b3 ^ 0x3b9f9c62;
      bVar2 = bVar11;
    }
    if (!bVar2) {
      return;
    }
    if ((int *)device_pnext == (int *)0x0) {
      h->h = h->h * 0x100000001b3;
      uVar10 = 0;
    }
    else {
      h->h = (ulong)(*(int *)((long)device_pnext + 0x10) != 0) ^ h->h * 0x100000001b3;
      uVar10 = (ulong)(*(int *)((long)device_pnext + 0x1c) != 0);
    }
    uVar5 = h->h * 0x100000001b3;
    goto LAB_001052d5;
  default:
    goto switchD_00104d55_default;
  }
  uVar10 = 0;
LAB_00104f03:
  uVar5 = h->h * 0x100000001b3;
LAB_00104f11:
  uVar5 = uVar5 ^ uVar10;
  goto LAB_00104f14;
LAB_00104fce:
  device_pnext = (int *)0x0;
LAB_00104fd0:
  if ((piVar3 == (int *)0x0) || (uVar5 = 1, piVar3[4] == 0)) {
    if ((int *)device_pnext == (int *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(*(int *)((long)device_pnext + 0x40) != 0);
    }
  }
  uVar10 = (ulong)(byte)(!feature_hash | (byte)uVar5);
  if ((feature_hash) && ((byte)uVar5 != 0)) {
    uVar4 = h->h * 0x100000001b3 ^ 0x3b9b75e3;
    uVar10 = uVar5;
    goto LAB_001052b2;
  }
  goto LAB_001052b7;
LAB_00105015:
  device_pnext = (int *)0x0;
LAB_00105017:
  if ((piVar3 == (int *)0x0) || (uVar5 = 1, piVar3[4] == 0)) {
    if ((int *)device_pnext == (int *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(*(int *)((long)device_pnext + 0xa8) != 0);
    }
  }
  uVar10 = (ulong)(byte)(!feature_hash | (byte)uVar5);
  if ((feature_hash) && ((byte)uVar5 != 0)) {
    uVar4 = h->h * 0x100000001b3 ^ 0x3b9eb5e8;
    uVar10 = uVar5;
    goto LAB_001052b2;
  }
  goto LAB_001052b7;
LAB_00104f87:
  device_pnext = (int *)0x0;
LAB_00104f89:
  if ((piVar3 == (int *)0x0) || (uVar5 = 1, piVar3[0xe] == 0)) {
    if ((int *)device_pnext == (int *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(*(int *)((long)device_pnext + 0x60) != 0);
    }
  }
  uVar10 = (ulong)(byte)(!feature_hash | (byte)uVar5);
  if ((feature_hash) && ((byte)uVar5 != 0)) {
    uVar4 = (h->h * 0x100000001b3 ^ 0x3b9d3ee9) * 0x100000001b3 ^ 10;
    uVar10 = uVar5;
LAB_001052b2:
    h->h = uVar4;
    uVar5 = uVar10;
  }
LAB_001052b7:
  if (uVar10 == 0) {
switchD_00104d55_default:
    return;
  }
  uVar10 = h->h * 0x100000001b3;
LAB_001052d5:
  uVar5 = uVar5 ^ uVar10;
LAB_00104f14:
  h->h = uVar5;
  return;
}

Assistant:

static void hash_variant(Hasher &h, VariantDependency dep,
                         const VkPhysicalDeviceProperties2 *props,
                         const VkApplicationInfo *info,
                         const void *device_pnext,
                         bool feature_hash)
{
	const VkApplicationInfo default_app_info = { VK_STRUCTURE_TYPE_APPLICATION_INFO };
	bool hash_enabled = true;

	if (!info)
		info = &default_app_info;

	switch (dep)
	{
	case VariantDependency::VendorID:
		h.u32(props ? props->properties.vendorID : 0);
		break;

	case VariantDependency::MutableDescriptorType:
	{
		auto *mut = find_pnext<VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT,
				device_pnext);

		bool enabled = mut && mut->mutableDescriptorType;

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::BufferDeviceAddress:
	{
		auto *bda = find_pnext<VkPhysicalDeviceBufferDeviceAddressFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES,
				device_pnext);
		auto *features12 = find_pnext<VkPhysicalDeviceVulkan12Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,
				device_pnext);

		bool enabled = (bda && bda->bufferDeviceAddress) ||
		               (features12 && features12->bufferDeviceAddress);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::FragmentShadingRate:
	{
		auto *vrs = find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR, device_pnext);

		bool enabled = vrs && (vrs->attachmentFragmentShadingRate ||
		                       vrs->pipelineFragmentShadingRate ||
		                       vrs->primitiveFragmentShadingRate);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR);
		}

		if (hash_enabled)
		{
			h.u32(uint32_t(vrs && vrs->attachmentFragmentShadingRate));
			h.u32(uint32_t(vrs && vrs->pipelineFragmentShadingRate));
			h.u32(uint32_t(vrs && vrs->primitiveFragmentShadingRate));
		}
		break;
	}

	case VariantDependency::DynamicRendering:
	{
		auto *dynamic_rendering = find_pnext<VkPhysicalDeviceDynamicRenderingFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES, device_pnext);
		auto *features13 = find_pnext<VkPhysicalDeviceVulkan13Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES, device_pnext);
		bool enabled = (dynamic_rendering && dynamic_rendering->dynamicRendering) ||
		               (features13 && features13->dynamicRendering);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::BindlessUBO:
	{
		auto *indexing = find_pnext<VkPhysicalDeviceDescriptorIndexingFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES,
				device_pnext);
		auto *features12 = find_pnext<VkPhysicalDeviceVulkan12Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,
				device_pnext);
		bool enabled = (indexing && indexing->descriptorBindingUniformBufferUpdateAfterBind) ||
		               (features12 && features12->descriptorBindingUniformBufferUpdateAfterBind);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
			{
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES);
				// 10th feature element.
				// Just arbitrary to distinguish potential hashing on different
				// sub-features of this struct at some other point.
				h.u32(10);
			}
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::DescriptorBuffer:
	{
		auto *descriptor_buffer = find_pnext<VkPhysicalDeviceDescriptorBufferFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT,
				device_pnext);
		bool enabled = descriptor_buffer && (descriptor_buffer->descriptorBuffer ||
		                                     descriptor_buffer->descriptorBufferPushDescriptors);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT);
		}

		if (hash_enabled)
		{
			h.u32(uint32_t(descriptor_buffer && descriptor_buffer->descriptorBuffer));
			h.u32(uint32_t(descriptor_buffer && descriptor_buffer->descriptorBufferPushDescriptors));
			// The other feature bits are highly unlikely to ever affect
			// pipeline construction in application in any meaningful way.
		}
		break;
	}

	case VariantDependency::ApplicationVersion:
		h.u32(info->applicationVersion);
		break;

	case VariantDependency::ApplicationVersionMajor:
		h.u32(VK_VERSION_MAJOR(info->applicationVersion));
		break;

	case VariantDependency::ApplicationVersionMinor:
		h.u32(VK_VERSION_MINOR(info->applicationVersion));
		break;

	case VariantDependency::ApplicationVersionPatch:
		h.u32(VK_VERSION_PATCH(info->applicationVersion));
		break;

	case VariantDependency::EngineVersion:
		h.u32(info->engineVersion);
		break;

	case VariantDependency::EngineVersionMajor:
		h.u32(VK_VERSION_MAJOR(info->engineVersion));
		break;

	case VariantDependency::EngineVersionMinor:
		h.u32(VK_VERSION_MINOR(info->engineVersion));
		break;

	case VariantDependency::EngineVersionPatch:
		h.u32(VK_VERSION_PATCH(info->engineVersion));
		break;

	case VariantDependency::ApplicationName:
		h.string(info->pApplicationName ? info->pApplicationName : "");
		break;

	case VariantDependency::EngineName:
		h.string(info->pEngineName ? info->pEngineName : "");
		break;

	default:
		break;
	}
}